

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkPotentiallyNullableOperands(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  Expr *e;
  Expr *e_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  char *local_38;
  
  if (this->effectsOnly == false) {
    TVar1 = (bin->super_Expr).super_Node._op;
    uVar5 = (ulong)TVar1;
    local_38 = "Comparison operation";
    if (3 < TVar1 - TO_GE) {
      local_38 = "Arithmetic operation";
    }
    if (uVar5 < 0x31) {
      if ((0x1f7f9e0000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x80000100000U >> (uVar5 & 0x3f) & 1) == 0) {
          return;
        }
        local_38 = "Arithmetic operation";
      }
      e = bin->_lhs;
      e_00 = bin->_rhs;
      bVar2 = isPotentiallyNullable(this,e);
      bVar3 = isPotentiallyNullable(this,e_00);
      if (((bVar2 || bVar3) && (bVar4 = couldBeString(this,e), !bVar4)) &&
         (bVar4 = couldBeString(this,e_00), !bVar4)) {
        if (bVar2) {
          if ((TVar1 == TO_NEWSLOT) || (TVar1 == TO_ASSIGN)) {
            if ((e->super_Node)._op != TO_ID) {
              report(this,&bin->_lhs->super_Node,0x3f);
            }
          }
          else {
            report(this,&bin->_lhs->super_Node,0x39,local_38);
          }
        }
        if (((bVar3) && (TVar1 != TO_ASSIGN)) && (TVar1 != TO_NEWSLOT)) {
          report(this,&bin->_rhs->super_Node,0x39,local_38);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPotentiallyNullableOperands(const BinExpr *bin) {

  if (effectsOnly)
    return;

  enum TreeOp op = bin->op();

  bool isRelOp = isBoolRelationOperator(op);
  bool isArithOp = isPureArithOperator(op);
  bool isAssign = op == TO_ASSIGN || op == TO_NEWSLOT;

  if (!isRelOp && !isArithOp && !isAssign)
    return;

  const Expr *lhs = bin->lhs();
  const Expr *rhs = bin->rhs();

  const char *opType = isRelOp ? "Comparison operation" : "Arithmetic operation";


  bool lhsNullable = isPotentiallyNullable(lhs);
  bool rhsNullable = isPotentiallyNullable(rhs);

  if (!lhsNullable && !rhsNullable)
    return;

  // string concat with nullable is OK
  if (couldBeString(lhs) || couldBeString(rhs))
    return;

  if (lhsNullable) {
    if (isAssign) {
      if (lhs->op() != TO_ID) { // -V522
        report(bin->lhs(), DiagnosticsId::DI_NULLABLE_ASSIGNMENT);
      }
    }
    else {
      report(bin->lhs(), DiagnosticsId::DI_NULLABLE_OPERANDS, opType);
    }
  }

  if (rhsNullable && !isAssign) {
    report(bin->rhs(), DiagnosticsId::DI_NULLABLE_OPERANDS, opType);
  }
}